

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UBool __thiscall
icu_63::Normalizer2Impl::hasCompBoundaryAfter
          (Normalizer2Impl *this,uint8_t *start,uint8_t *p,UBool onlyContiguous)

{
  byte bVar1;
  UBool UVar2;
  int32_t iVar3;
  uint uVar4;
  
  if (start != p) {
    bVar1 = p[-1];
    uVar4 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      iVar3 = ucptrie_internalU8PrevIndex_63(this->normTrie,(uint)bVar1,start,p + -1);
      uVar4 = iVar3 >> 3;
    }
    UVar2 = norm16HasCompBoundaryAfter
                      (this,*(uint16_t *)((long)(this->normTrie->data).ptr0 + (long)(int)uVar4 * 2),
                       onlyContiguous);
    return UVar2;
  }
  return '\x01';
}

Assistant:

UBool Normalizer2Impl::hasCompBoundaryAfter(const uint8_t *start, const uint8_t *p,
                                            UBool onlyContiguous) const {
    if (start == p) {
        return TRUE;
    }
    uint16_t norm16;
    UCPTRIE_FAST_U8_PREV(normTrie, UCPTRIE_16, start, p, norm16);
    return norm16HasCompBoundaryAfter(norm16, onlyContiguous);
}